

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apx_control_main.c
# Opt level: O0

int main(int argc,char **argv)

{
  adt_error_t aVar1;
  int iVar2;
  char *pcVar3;
  undefined8 uVar4;
  long lVar5;
  size_t sVar6;
  char *address;
  dtl_dv_t *dv;
  char *input_file_path;
  uint local_20;
  int iStack_1c;
  uint16_t dummy_port;
  argparse_result_t result;
  int retval;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  m_connect_port = 0x13ec;
  iStack_1c = 0;
  _result = argv;
  argv_local._0_4_ = argc;
  local_20 = argparse_exec(argc,argv,argparse_cbk);
  if (local_20 == 0) {
    if ((m_display_version & 1U) != 0) {
      print_version();
    }
    if ((m_display_help & 1U) == 0) {
      if ((m_connect_resource_type == '\0') &&
         ((m_connect_resource_type =
                apx_parse_resource_name
                          (m_connect_address_default,&m_connect_address,(long)&input_file_path + 6),
          m_connect_resource_type == '\0' || (m_connect_resource_type == '\x05')))) {
        __assert_fail("(m_connect_resource_type != APX_RESOURCE_TYPE_UNKNOWN) && (m_connect_resource_type != APX_RESOURCE_TYPE_ERROR)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/app/apx_control/src/apx_control_main.c"
                      ,0x81,"int main(int, char **)");
      }
      if (m_input_file_path == (adt_str_t *)0x0) {
        if (m_name != (adt_str_t *)0x0) {
          if (m_value == (adt_str_t *)0x0) {
            printf("Error: missing value argument\n");
            print_usage(*_result);
            goto switchD_00102608_default;
          }
          aVar1 = build_json_message(m_name,m_value);
          local_20 = (uint)aVar1;
          if (local_20 != 0) {
            iStack_1c = -1;
            goto switchD_00102608_default;
          }
        }
      }
      else {
        pcVar3 = (char *)adt_str_cstr(m_input_file_path);
        local_20 = read_message_from_file(pcVar3);
        if (local_20 == 0) {
          uVar4 = adt_str_cstr(m_message);
          lVar5 = dtl_json_load_cstr(uVar4);
          if (lVar5 == 0) {
            fprintf(_stderr,"Error: JSON data validation error while parsing %s\n",pcVar3);
            iStack_1c = -1;
            goto switchD_00102608_default;
          }
          dtl_dv_dec_ref(lVar5);
        }
        else {
          fprintf(_stderr,"Error: Failed to read contents of file %s\n",pcVar3);
        }
      }
      if (((m_message == (adt_str_t *)0x0) || (m_connect_resource_type == '\0')) ||
         (m_connect_resource_type == '\x05')) {
        if (((m_message == (adt_str_t *)0x0) && ((m_display_version & 1U) == 0)) &&
           ((m_display_help & 1U) == 0)) {
          printf("No message to send\n");
        }
      }
      else {
        pcVar3 = (char *)adt_str_cstr(m_connect_address);
        if (pcVar3 == (char *)0x0) {
          __assert_fail("address != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/app/apx_control/src/apx_control_main.c"
                        ,0xb4,"int main(int, char **)");
        }
        switch(m_connect_resource_type) {
        case '\x01':
          connect_and_send_message_tcp(pcVar3,m_connect_port,'\x02');
          break;
        case '\x02':
          connect_and_send_message_tcp(pcVar3,m_connect_port,'\n');
          break;
        case '\x03':
          connect_and_send_message_unix(pcVar3);
          break;
        case '\x04':
          sVar6 = strlen(pcVar3);
          if ((sVar6 == 0) || (iVar2 = strcmp(pcVar3,"localhost"), iVar2 == 0)) {
            connect_and_send_message_tcp("127.0.0.1",m_connect_port,'\x02');
          }
          else {
            fprintf(_stderr,"Error: Unsupported connection name \"%s\"\n",pcVar3);
            iStack_1c = -1;
          }
        }
      }
    }
    else {
      print_usage(*_result);
    }
  }
  else {
    printf("Error parsing argument (%d)\n",(ulong)local_20);
    print_usage(*_result);
  }
switchD_00102608_default:
  application_cleanup();
  return iStack_1c;
}

Assistant:

int main(int argc, char **argv)
{
   m_connect_port = connect_port_default;
   int retval = 0;
   argparse_result_t result = argparse_exec(argc, (const char**) argv, argparse_cbk);
   if (result == ARGPARSE_SUCCESS)
   {
#ifdef _WIN32
      if (init_wsa() != 0)
      {
         int err = WSAGetLastError();
         fprintf(stderr, "WSAStartup failed with error: %d\n", err);
         retval = 1;
         goto SHUTDOWN;
      }
#endif
      if (m_display_version)
      {
         print_version();
      }
      if (m_display_help)
      {
         print_usage(argv[0]);
      }
      else
      {
         if (m_connect_resource_type == APX_RESOURCE_TYPE_UNKNOWN)
         {
            uint16_t dummy_port;
            m_connect_resource_type = apx_parse_resource_name(m_connect_address_default, &m_connect_address, &dummy_port);
            (void) dummy_port;
            assert( (m_connect_resource_type != APX_RESOURCE_TYPE_UNKNOWN) && (m_connect_resource_type != APX_RESOURCE_TYPE_ERROR) );
         }
         if (m_input_file_path != 0)
         {
            const char *input_file_path = adt_str_cstr(m_input_file_path);
            result = read_message_from_file(input_file_path);

            if (result != APX_NO_ERROR)
            {
               fprintf(stderr, "Error: Failed to read contents of file %s\n", input_file_path);
            }
            else
            {
               dtl_dv_t *dv = dtl_json_load_cstr(adt_str_cstr(m_message));
               if (dv == 0)
               {
                  fprintf(stderr, "Error: JSON data validation error while parsing %s\n", input_file_path);
                  retval = -1;
                  goto SHUTDOWN;
               }
               else
               {
                  dtl_dec_ref(dv);
               }
            }
         }
         else
         {
            if (m_name != 0)
            {
               if (m_value == 0)
               {
                  printf("Error: missing value argument\n");
                  print_usage(argv[0]);
                  goto SHUTDOWN;
               }
               else
               {
                  result = build_json_message(m_name, m_value);
                  if (result != ADT_NO_ERROR)
                  {
                     retval = -1;
                     goto SHUTDOWN;
                  }
               }
            }
         }
         if ( (m_message != 0) && (m_connect_resource_type != APX_RESOURCE_TYPE_UNKNOWN) && (m_connect_resource_type != APX_RESOURCE_TYPE_ERROR) )
         {
            const char *address;
            address = adt_str_cstr(m_connect_address);
            assert(address != 0);
            switch(m_connect_resource_type)
            {
            case APX_RESOURCE_TYPE_IPV4: //fall-trough
               connect_and_send_message_tcp(address, m_connect_port, AF_INET);
               break;
            case APX_RESOURCE_TYPE_IPV6:
               connect_and_send_message_tcp(address, m_connect_port, AF_INET6);
               break;
            case APX_RESOURCE_TYPE_FILE:
   #ifdef _WIN32
               printf("UNIX domain socket path not supported in Windows\n");
   #else
               connect_and_send_message_unix(address);
   #endif
               break;
            case APX_RESOURCE_TYPE_NAME:
               if ( (strlen(address) == 0) || (strcmp(address, "localhost") == 0) )
               {
                  connect_and_send_message_tcp("127.0.0.1", m_connect_port, AF_INET);
               }
               else
               {
                  fprintf(stderr, "Error: Unsupported connection name \"%s\"\n", address);
                  retval = -1;
               }
               break;
            }
         }
         else if (m_message == 0)
         {
            if (!m_display_version && !m_display_help)
            {
               printf("No message to send\n");
            }
         }
      }
   }
   else
   {
      printf("Error parsing argument (%d)\n", (int) result);
      print_usage(argv[0]);
   }
SHUTDOWN:
   application_cleanup();
   return retval;
}